

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_hlsl.cpp
# Opt level: O3

void __thiscall spirv_cross::CompilerHLSL::analyze_meshlet_writes(CompilerHLSL *this)

{
  TypedID<(spirv_cross::Types)0> *pTVar1;
  size_t sVar2;
  Variant *pVVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  bool bVar6;
  bool bVar7;
  StorageClass SVar8;
  uint32_t id_per_vertex;
  SPIRVariable *var;
  SPIRType *pSVar9;
  Bitset *pBVar10;
  char *pcVar11;
  uint32_t *puVar12;
  uint32_t id_per_primitive;
  ulong uVar13;
  _Hash_node_base *p_Var14;
  TypedID<(spirv_cross::Types)0> *pTVar15;
  bool need_per_vertex;
  bool need_per_primitive;
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  processed_func_ids;
  char local_c2;
  char local_c1;
  uint32_t local_c0;
  uint32_t local_bc;
  LoopLock local_b8;
  Bitset local_b0;
  Bitset local_70;
  
  local_c0 = 0;
  local_bc = 0;
  local_c1 = '\0';
  local_c2 = '\0';
  ParsedIR::create_loop_hard_lock(&(this->super_CompilerGLSL).super_Compiler.ir);
  sVar2 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
          super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.buffer_size;
  if (sVar2 == 0) {
    ParsedIR::LoopLock::~LoopLock(&local_b8);
  }
  else {
    pTVar15 = (this->super_CompilerGLSL).super_Compiler.ir.ids_for_type[2].
              super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.ptr;
    pTVar1 = pTVar15 + sVar2;
    do {
      pVVar3 = (this->super_CompilerGLSL).super_Compiler.ir.ids.
               super_VectorView<spirv_cross::Variant>.ptr;
      if (pVVar3[pTVar15->id].type == TypeVariable) {
        var = Variant::get<spirv_cross::SPIRVariable>(pVVar3 + pTVar15->id);
        pSVar9 = Variant::get<spirv_cross::SPIRType>
                           ((this->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr +
                            *(uint *)&(var->super_IVariant).field_0xc);
        bVar6 = Compiler::has_decoration
                          ((Compiler *)this,(ID)(pSVar9->super_IVariant).self.id,Block);
        SVar8 = var->storage;
        if (bVar6 && SVar8 == Output) {
          bVar7 = Compiler::is_builtin_variable((Compiler *)this,var);
          if (!bVar7) {
            SVar8 = var->storage;
            goto LAB_0022fe9c;
          }
          Compiler::get_buffer_block_flags
                    (&local_b0,(Compiler *)this,(VariableID)(var->super_IVariant).self.id);
          auVar4._8_8_ = 0;
          auVar4._0_8_ = local_b0.higher._M_h._M_bucket_count;
          uVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1497)) % auVar4,0);
          puVar12 = &local_c0;
          if (local_b0.higher._M_h._M_buckets[uVar13 & 0xffffffff] != (__node_base_ptr)0x0) {
            p_Var14 = local_b0.higher._M_h._M_buckets[uVar13 & 0xffffffff]->_M_nxt;
            puVar12 = &local_bc;
            if (*(int *)&p_Var14[1]._M_nxt != 0x1497) {
              do {
                p_Var14 = p_Var14->_M_nxt;
                if ((p_Var14 == (_Hash_node_base *)0x0) ||
                   ((ulong)*(uint *)&p_Var14[1]._M_nxt % local_b0.higher._M_h._M_bucket_count !=
                    uVar13)) {
                  puVar12 = &local_c0;
                  goto LAB_0022ffae;
                }
              } while (*(uint *)&p_Var14[1]._M_nxt != 0x1497);
              puVar12 = &local_bc;
            }
          }
LAB_0022ffae:
          *puVar12 = (var->super_IVariant).self.id;
        }
        else {
LAB_0022fe9c:
          if (SVar8 != Output) goto LAB_0022ffbd;
          local_b0.lower = 0;
          local_b0.higher._M_h._M_buckets = &local_b0.higher._M_h._M_single_bucket;
          local_b0.higher._M_h._M_bucket_count = 1;
          local_b0.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
          local_b0.higher._M_h._M_element_count = 0;
          local_b0.higher._M_h._M_rehash_policy._M_max_load_factor = 1.0;
          local_b0.higher._M_h._M_rehash_policy._M_next_resize = 0;
          local_b0.higher._M_h._M_single_bucket = (__node_base_ptr)0x0;
          if (bVar6) {
            Compiler::get_buffer_block_flags
                      (&local_70,(Compiler *)this,(VariableID)(var->super_IVariant).self.id);
            local_b0.lower = local_70.lower;
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::_M_move_assign(&local_b0.higher._M_h,&local_70.higher);
            ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::~_Hashtable(&local_70.higher._M_h);
          }
          else {
            pBVar10 = Compiler::get_decoration_bitset
                                ((Compiler *)this,(ID)(var->super_IVariant).self.id);
            local_b0.lower = pBVar10->lower;
            if (pBVar10 != &local_b0) {
              ::std::
              _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
              ::
              _M_assign_elements<std::_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>const&>
                        ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                          *)&local_b0.higher,&(pBVar10->higher)._M_h);
            }
          }
          auVar5._8_8_ = 0;
          auVar5._0_8_ = local_b0.higher._M_h._M_bucket_count;
          uVar13 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1497)) % auVar5,0);
          pcVar11 = &local_c2;
          if (local_b0.higher._M_h._M_buckets[uVar13 & 0xffffffff] != (__node_base_ptr)0x0) {
            p_Var14 = local_b0.higher._M_h._M_buckets[uVar13 & 0xffffffff]->_M_nxt;
            pcVar11 = &local_c1;
            if (*(int *)&p_Var14[1]._M_nxt != 0x1497) {
              do {
                p_Var14 = p_Var14->_M_nxt;
                if ((p_Var14 == (_Hash_node_base *)0x0) ||
                   ((ulong)*(uint *)&p_Var14[1]._M_nxt % local_b0.higher._M_h._M_bucket_count !=
                    uVar13)) {
                  pcVar11 = &local_c2;
                  goto LAB_0022ffa1;
                }
              } while (*(uint *)&p_Var14[1]._M_nxt != 0x1497);
              pcVar11 = &local_c1;
            }
          }
LAB_0022ffa1:
          *pcVar11 = '\x01';
        }
        ::std::
        _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
        ::~_Hashtable(&local_b0.higher._M_h);
      }
LAB_0022ffbd:
      id_per_vertex = local_c0;
      pTVar15 = pTVar15 + 1;
    } while (pTVar15 != pTVar1);
    ParsedIR::LoopLock::~LoopLock(&local_b8);
    if (id_per_vertex != 0) goto LAB_0023000b;
  }
  id_per_vertex = 0;
  if (local_c2 == '\x01') {
    id_per_vertex =
         analyze_meshlet_writes::anon_class_8_1_8991fb9c::operator()
                   ((anon_class_8_1_8991fb9c *)this,"gl_MeshPerVertexEXT","gl_MeshVerticesEXT",false
                   );
  }
LAB_0023000b:
  id_per_primitive = local_bc;
  if ((local_bc == 0) && (id_per_primitive = 0, local_c1 == '\x01')) {
    id_per_primitive =
         analyze_meshlet_writes::anon_class_8_1_8991fb9c::operator()
                   ((anon_class_8_1_8991fb9c *)this,"gl_MeshPerPrimitiveEXT","gl_MeshPrimitivesEXT",
                    true);
  }
  local_b0.lower = (uint64_t)&local_b0.higher._M_h._M_rehash_policy._M_next_resize;
  local_b0.higher._M_h._M_buckets = (__buckets_ptr)0x1;
  local_b0.higher._M_h._M_bucket_count = 0;
  local_b0.higher._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_b0.higher._M_h._M_element_count =
       CONCAT44(local_b0.higher._M_h._M_element_count._4_4_,0x3f800000);
  local_b0.higher._M_h._M_rehash_policy._M_max_load_factor = 0.0;
  local_b0.higher._M_h._M_rehash_policy._4_4_ = 0;
  local_b0.higher._M_h._M_rehash_policy._M_next_resize = 0;
  analyze_meshlet_writes
            (this,(this->super_CompilerGLSL).super_Compiler.ir.default_entry_point.id,id_per_vertex,
             id_per_primitive,
             (unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
              *)&local_b0);
  ::std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable((_Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                 *)&local_b0);
  return;
}

Assistant:

void CompilerHLSL::analyze_meshlet_writes()
{
	uint32_t id_per_vertex = 0;
	uint32_t id_per_primitive = 0;
	bool need_per_primitive = false;
	bool need_per_vertex = false;

	ir.for_each_typed_id<SPIRVariable>([&](uint32_t, SPIRVariable &var) {
		auto &type = this->get<SPIRType>(var.basetype);
		bool block = has_decoration(type.self, DecorationBlock);
		if (var.storage == StorageClassOutput && block && is_builtin_variable(var))
		{
			auto flags = get_buffer_block_flags(var.self);
			if (flags.get(DecorationPerPrimitiveEXT))
				id_per_primitive = var.self;
			else
				id_per_vertex = var.self;
		}
		else if (var.storage == StorageClassOutput)
		{
			Bitset flags;
			if (block)
				flags = get_buffer_block_flags(var.self);
			else
				flags = get_decoration_bitset(var.self);

			if (flags.get(DecorationPerPrimitiveEXT))
				need_per_primitive = true;
			else
				need_per_vertex = true;
		}
	});

	// If we have per-primitive outputs, and no per-primitive builtins,
	// empty version of gl_MeshPerPrimitiveEXT will be emitted.
	// If we don't use block IO for vertex output, we'll also need to synthesize the PerVertex block.

	const auto generate_block = [&](const char *block_name, const char *instance_name, bool per_primitive) -> uint32_t {
		auto &execution = get_entry_point();

		uint32_t op_type = ir.increase_bound_by(4);
		uint32_t op_arr = op_type + 1;
		uint32_t op_ptr = op_type + 2;
		uint32_t op_var = op_type + 3;

		auto &type = set<SPIRType>(op_type, OpTypeStruct);
		type.basetype = SPIRType::Struct;
		set_name(op_type, block_name);
		set_decoration(op_type, DecorationBlock);
		if (per_primitive)
			set_decoration(op_type, DecorationPerPrimitiveEXT);

		auto &arr = set<SPIRType>(op_arr, type);
		arr.parent_type = type.self;
		arr.array.push_back(per_primitive ? execution.output_primitives : execution.output_vertices);
		arr.array_size_literal.push_back(true);

		auto &ptr = set<SPIRType>(op_ptr, arr);
		ptr.parent_type = arr.self;
		ptr.pointer = true;
		ptr.pointer_depth++;
		ptr.storage = StorageClassOutput;
		set_decoration(op_ptr, DecorationBlock);
		set_name(op_ptr, block_name);

		auto &var = set<SPIRVariable>(op_var, op_ptr, StorageClassOutput);
		if (per_primitive)
			set_decoration(op_var, DecorationPerPrimitiveEXT);
		set_name(op_var, instance_name);
		execution.interface_variables.push_back(var.self);

		return op_var;
	};

	if (id_per_vertex == 0 && need_per_vertex)
		id_per_vertex = generate_block("gl_MeshPerVertexEXT", "gl_MeshVerticesEXT", false);
	if (id_per_primitive == 0 && need_per_primitive)
		id_per_primitive = generate_block("gl_MeshPerPrimitiveEXT", "gl_MeshPrimitivesEXT", true);

	unordered_set<uint32_t> processed_func_ids;
	analyze_meshlet_writes(ir.default_entry_point, id_per_vertex, id_per_primitive, processed_func_ids);
}